

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yv12config.c
# Opt level: O1

int aom_realloc_frame_buffer
              (YV12_BUFFER_CONFIG *ybf,int width,int height,int ss_x,int ss_y,int use_highbitdepth,
              int border,int byte_alignment,aom_codec_frame_buffer_t *fb,
              aom_get_frame_buffer_cb_fn_t cb,void *cb_priv,_Bool alloc_pyramid,
              int alloc_y_plane_only)

{
  byte bVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  ulong uVar5;
  uint8_t *puVar6;
  ImagePyramid *pIVar7;
  CornerList *pCVar8;
  byte bVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  uint uVar15;
  int iVar16;
  ulong size;
  uint uVar17;
  
  if (ybf == (YV12_BUFFER_CONFIG *)0x0) {
LAB_00381740:
    iVar16 = 2;
  }
  else {
    uVar17 = width + 7U & 0xfffffff8;
    uVar15 = height + 7U & 0xfffffff8;
    bVar1 = (byte)ss_y;
    iVar16 = (int)uVar15 >> (bVar1 & 0x1f);
    bVar9 = (byte)ss_x;
    if ((border & 0x1fU) == 0) {
      uVar10 = uVar17 + border * 2 + 0x1f & 0xffffffe0;
      lVar11 = (long)(int)uVar10 * (long)(int)(uVar15 + border * 2) + (long)byte_alignment;
      iVar2 = 0;
      if (alloc_y_plane_only != 0) goto LAB_003813f3;
      iVar14 = (int)uVar10 >> (bVar9 & 0x1f);
      lVar13 = (long)iVar14 * (long)(iVar16 + (border >> (bVar1 & 0x1f)) * 2) + (long)byte_alignment
      ;
    }
    else {
      iVar2 = 2;
      uVar10 = 0;
      lVar11 = 0;
LAB_003813f3:
      iVar14 = 0;
      lVar13 = 0;
    }
    if ((border & 0x1fU) != 0) {
      return iVar2;
    }
    size = (lVar11 + lVar13 * 2) * (long)(use_highbitdepth + 1);
    uVar5 = size;
    if (alloc_pyramid) {
      sVar3 = aom_get_pyramid_alloc_size(width,height,use_highbitdepth != 0);
      sVar4 = av1_get_corner_list_size();
      uVar5 = sVar4 + sVar3 + size;
    }
    if (0x40000000 < uVar5) {
      return 2;
    }
    if (cb == (aom_get_frame_buffer_cb_fn_t)0x0) {
      if (ybf->buffer_alloc_sz <= size && size - ybf->buffer_alloc_sz != 0) {
        aom_free(ybf->buffer_alloc);
        ybf->buffer_alloc = (uint8_t *)0x0;
        ybf->buffer_alloc_sz = 0;
        puVar6 = (uint8_t *)aom_memalign(0x20,size);
        ybf->buffer_alloc = puVar6;
        if (puVar6 == (uint8_t *)0x0) goto LAB_00381740;
        ybf->buffer_alloc_sz = size;
        memset(puVar6,0,size);
      }
    }
    else {
      iVar2 = (*cb)(cb_priv,size + 0x1f,fb);
      if (iVar2 < 0) goto LAB_00381740;
      if (fb->data == (uint8_t *)0x0) {
        return 2;
      }
      if (fb->size < size + 0x1f) {
        return 2;
      }
      ybf->buffer_alloc = (uint8_t *)((ulong)(fb->data + 0x1f) & 0xffffffffffffffe0);
    }
    (ybf->field_2).field_0.y_crop_width = width;
    (ybf->field_3).field_0.y_crop_height = height;
    (ybf->field_0).field_0.y_width = uVar17;
    (ybf->field_1).field_0.y_height = uVar15;
    (ybf->field_4).field_0.y_stride = uVar10;
    (ybf->field_2).field_0.uv_crop_width = width + ss_x >> (bVar9 & 0x1f);
    (ybf->field_3).field_0.uv_crop_height = ss_y + height >> (bVar1 & 0x1f);
    (ybf->field_0).field_0.uv_width = (int)uVar17 >> (bVar9 & 0x1f);
    (ybf->field_1).field_0.uv_height = iVar16;
    (ybf->field_4).field_0.uv_stride = iVar14;
    ybf->border = border;
    ybf->frame_size = size;
    ybf->subsampling_x = ss_x;
    ybf->subsampling_y = ss_y;
    puVar6 = (uint8_t *)((ulong)ybf->buffer_alloc >> 1);
    if (use_highbitdepth == 0) {
      puVar6 = ybf->buffer_alloc;
    }
    ybf->flags = (uint)(use_highbitdepth != 0) << 3;
    lVar12 = (long)(int)(byte_alignment + (uint)(byte_alignment == 0));
    uVar5 = -lVar12;
    (ybf->field_5).field_0.y_buffer =
         (uint8_t *)
         ((ulong)(puVar6 + lVar12 + (long)(int)(uVar10 * border) + (long)border + -1) & uVar5);
    if (alloc_y_plane_only == 0) {
      (ybf->field_5).field_0.u_buffer =
           (uint8_t *)
           ((ulong)(puVar6 + (long)(iVar14 * (border >> (bVar1 & 0x1f))) +
                             lVar12 + -1 + (border >> (bVar9 & 0x1f)) + lVar11) & uVar5);
      (ybf->field_5).field_0.v_buffer =
           (uint8_t *)
           ((ulong)(puVar6 + (long)(iVar14 * (border >> (bVar1 & 0x1f))) +
                             lVar12 + -1 + (border >> (bVar9 & 0x1f)) + lVar11 + lVar13) & uVar5);
    }
    else {
      (ybf->field_5).field_0.u_buffer = (uint8_t *)0x0;
      (ybf->field_5).field_0.v_buffer = (uint8_t *)0x0;
    }
    ybf->use_external_reference_buffers = 0;
    if (ybf->y_pyramid != (ImagePyramid *)0x0) {
      aom_free_pyramid(ybf->y_pyramid);
      ybf->y_pyramid = (image_pyramid *)0x0;
    }
    if (ybf->corners != (CornerList *)0x0) {
      av1_free_corner_list(ybf->corners);
      ybf->corners = (corner_list *)0x0;
    }
    if (alloc_pyramid) {
      pIVar7 = aom_alloc_pyramid(width,height,use_highbitdepth != 0);
      ybf->y_pyramid = pIVar7;
      if (pIVar7 == (ImagePyramid *)0x0) goto LAB_00381740;
      pCVar8 = av1_alloc_corner_list();
      ybf->corners = pCVar8;
      if (pCVar8 == (CornerList *)0x0) {
        return 2;
      }
    }
    ybf->corrupted = 0;
    iVar16 = 0;
  }
  return iVar16;
}

Assistant:

int aom_realloc_frame_buffer(YV12_BUFFER_CONFIG *ybf, int width, int height,
                             int ss_x, int ss_y, int use_highbitdepth,
                             int border, int byte_alignment,
                             aom_codec_frame_buffer_t *fb,
                             aom_get_frame_buffer_cb_fn_t cb, void *cb_priv,
                             bool alloc_pyramid, int alloc_y_plane_only) {
  if (ybf) {
    int y_stride = 0;
    int uv_stride = 0;
    uint64_t yplane_size = 0;
    uint64_t uvplane_size = 0;
    const int aligned_width = (width + 7) & ~7;
    const int aligned_height = (height + 7) & ~7;
    const int uv_width = aligned_width >> ss_x;
    const int uv_height = aligned_height >> ss_y;
    const int uv_border_w = border >> ss_x;
    const int uv_border_h = border >> ss_y;

    int error = calc_stride_and_planesize(
        ss_x, ss_y, aligned_width, aligned_height, border, byte_alignment,
        alloc_y_plane_only, &y_stride, &uv_stride, &yplane_size, &uvplane_size,
        uv_height);
    if (error) return error;
    return realloc_frame_buffer_aligned(
        ybf, width, height, ss_x, ss_y, use_highbitdepth, border,
        byte_alignment, fb, cb, cb_priv, y_stride, yplane_size, uvplane_size,
        aligned_width, aligned_height, uv_width, uv_height, uv_stride,
        uv_border_w, uv_border_h, alloc_pyramid, alloc_y_plane_only);
  }
  return AOM_CODEC_MEM_ERROR;
}